

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationIterator::nextCE32FromContraction
          (CollationIterator *this,CollationData *d,uint32_t contractionCE32,UChar *p,uint32_t ce32,
          UChar32 c,UErrorCode *errorCode)

{
  UBool UVar1;
  uint16_t uVar2;
  UChar32 UVar3;
  UStringTrieResult local_78;
  UChar32 nextCp;
  UStringTrieResult match;
  ConstChar16Ptr local_68;
  undefined1 local_60 [8];
  UCharsTrie suffixes;
  int32_t sinceMatch;
  int32_t lookAhead;
  UChar32 c_local;
  uint32_t ce32_local;
  UChar *p_local;
  uint32_t contractionCE32_local;
  CollationData *d_local;
  CollationIterator *this_local;
  
  suffixes._28_4_ = 1;
  suffixes.remainingMatchLength_ = 1;
  ConstChar16Ptr::ConstChar16Ptr(&local_68,p);
  UCharsTrie::UCharsTrie((UCharsTrie *)local_60,&local_68);
  ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  if ((this->skipped != (SkippedState *)0x0) &&
     (UVar1 = SkippedState::isEmpty(this->skipped), UVar1 == '\0')) {
    SkippedState::saveTrieState(this->skipped,(UCharsTrie *)local_60);
  }
  local_78 = UCharsTrie::firstForCodePoint((UCharsTrie *)local_60,c);
  sinceMatch = c;
  lookAhead = ce32;
  do {
    if ((int)local_78 < 2) {
      if ((local_78 == USTRINGTRIE_NO_MATCH) ||
         (UVar3 = nextSkippedCodePoint(this,errorCode), UVar3 < 0)) break;
      suffixes.remainingMatchLength_ = suffixes.remainingMatchLength_ + 1;
      sinceMatch = UVar3;
    }
    else {
      lookAhead = UCharsTrie::getValue((UCharsTrie *)local_60);
      this_local._4_4_ = lookAhead;
      if (((local_78 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) ||
         (sinceMatch = nextSkippedCodePoint(this,errorCode), sinceMatch < 0)) goto LAB_00293443;
      if ((this->skipped != (SkippedState *)0x0) &&
         (UVar1 = SkippedState::isEmpty(this->skipped), UVar1 == '\0')) {
        SkippedState::saveTrieState(this->skipped,(UCharsTrie *)local_60);
      }
      suffixes.remainingMatchLength_ = 1;
    }
    suffixes._28_4_ = suffixes._28_4_ + 1;
    local_78 = UCharsTrie::nextForCodePoint((UCharsTrie *)local_60,sinceMatch);
  } while( true );
  if (((contractionCE32 & 0x400) != 0) &&
     (((contractionCE32 & 0x100) == 0 || (suffixes.remainingMatchLength_ < (int)suffixes._28_4_))))
  {
    if (1 < suffixes.remainingMatchLength_) {
      backwardNumSkipped(this,suffixes.remainingMatchLength_,errorCode);
      sinceMatch = nextSkippedCodePoint(this,errorCode);
      suffixes._28_4_ = suffixes._28_4_ - (suffixes.remainingMatchLength_ + -1);
      suffixes.remainingMatchLength_ = 1;
    }
    uVar2 = CollationData::getFCD16(d,sinceMatch);
    if (0xff < uVar2) {
      this_local._4_4_ =
           nextCE32FromDiscontiguousContraction
                     (this,d,(UCharsTrie *)local_60,lookAhead,suffixes._28_4_,sinceMatch,errorCode);
      goto LAB_00293443;
    }
  }
  backwardNumSkipped(this,suffixes.remainingMatchLength_,errorCode);
  this_local._4_4_ = lookAhead;
LAB_00293443:
  UCharsTrie::~UCharsTrie((UCharsTrie *)local_60);
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationIterator::nextCE32FromContraction(const CollationData *d, uint32_t contractionCE32,
                                           const UChar *p, uint32_t ce32, UChar32 c,
                                           UErrorCode &errorCode) {
    // c: next code point after the original one

    // Number of code points read beyond the original code point.
    // Needed for discontiguous contraction matching.
    int32_t lookAhead = 1;
    // Number of code points read since the last match (initially only c).
    int32_t sinceMatch = 1;
    // Normally we only need a contiguous match,
    // and therefore need not remember the suffixes state from before a mismatch for retrying.
    // If we are already processing skipped combining marks, then we do track the state.
    UCharsTrie suffixes(p);
    if(skipped != NULL && !skipped->isEmpty()) { skipped->saveTrieState(suffixes); }
    UStringTrieResult match = suffixes.firstForCodePoint(c);
    for(;;) {
        UChar32 nextCp;
        if(USTRINGTRIE_HAS_VALUE(match)) {
            ce32 = (uint32_t)suffixes.getValue();
            if(!USTRINGTRIE_HAS_NEXT(match) || (c = nextSkippedCodePoint(errorCode)) < 0) {
                return ce32;
            }
            if(skipped != NULL && !skipped->isEmpty()) { skipped->saveTrieState(suffixes); }
            sinceMatch = 1;
        } else if(match == USTRINGTRIE_NO_MATCH || (nextCp = nextSkippedCodePoint(errorCode)) < 0) {
            // No match for c, or partial match (USTRINGTRIE_NO_VALUE) and no further text.
            // Back up if necessary, and try a discontiguous contraction.
            if((contractionCE32 & Collation::CONTRACT_TRAILING_CCC) != 0 &&
                    // Discontiguous contraction matching extends an existing match.
                    // If there is no match yet, then there is nothing to do.
                    ((contractionCE32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) == 0 ||
                        sinceMatch < lookAhead)) {
                // The last character of at least one suffix has lccc!=0,
                // allowing for discontiguous contractions.
                // UCA S2.1.1 only processes non-starters immediately following
                // "a match in the table" (sinceMatch=1).
                if(sinceMatch > 1) {
                    // Return to the state after the last match.
                    // (Return to sinceMatch=0 and re-fetch the first partially-matched character.)
                    backwardNumSkipped(sinceMatch, errorCode);
                    c = nextSkippedCodePoint(errorCode);
                    lookAhead -= sinceMatch - 1;
                    sinceMatch = 1;
                }
                if(d->getFCD16(c) > 0xff) {
                    return nextCE32FromDiscontiguousContraction(
                        d, suffixes, ce32, lookAhead, c, errorCode);
                }
            }
            break;
        } else {
            // Continue after partial match (USTRINGTRIE_NO_VALUE) for c.
            // It does not have a result value, therefore it is not itself "a match in the table".
            // If a partially-matched c has ccc!=0 then
            // it might be skipped in discontiguous contraction.
            c = nextCp;
            ++sinceMatch;
        }
        ++lookAhead;
        match = suffixes.nextForCodePoint(c);
    }
    backwardNumSkipped(sinceMatch, errorCode);
    return ce32;
}